

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

void httplib::detail::get_remote_ip_and_port(socket_t sock,string *ip,int *port)

{
  int iVar1;
  socklen_t addr_len;
  socklen_t len;
  ucred ucred;
  sockaddr_storage addr;
  
  addr_len = 0x80;
  iVar1 = getpeername(sock,(sockaddr *)&addr,&addr_len);
  if (iVar1 == 0) {
    if (addr.ss_family == 1) {
      len = 0xc;
      iVar1 = getsockopt(sock,1,0x11,&ucred,&len);
      if (iVar1 == 0) {
        *port = ucred.pid;
      }
    }
    else {
      get_ip_and_port(&addr,addr_len,ip,port);
    }
  }
  return;
}

Assistant:

inline void get_remote_ip_and_port(socket_t sock, std::string &ip, int &port) {
  struct sockaddr_storage addr;
  socklen_t addr_len = sizeof(addr);

  if (!getpeername(sock, reinterpret_cast<struct sockaddr *>(&addr),
                   &addr_len)) {
#ifndef _WIN32
    if (addr.ss_family == AF_UNIX) {
#if defined(__linux__)
      struct ucred ucred;
      socklen_t len = sizeof(ucred);
      if (getsockopt(sock, SOL_SOCKET, SO_PEERCRED, &ucred, &len) == 0) {
        port = ucred.pid;
      }
#elif defined(SOL_LOCAL) && defined(SO_PEERPID) // __APPLE__
      pid_t pid;
      socklen_t len = sizeof(pid);
      if (getsockopt(sock, SOL_LOCAL, SO_PEERPID, &pid, &len) == 0) {
        port = pid;
      }
#endif
      return;
    }
#endif
    get_ip_and_port(addr, addr_len, ip, port);
  }
}